

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1319::run(TestCase1319 *this)

{
  DebugExpression<bool> _kjCondition;
  Fault f;
  int local_15c;
  DebugComparison<int,_unsigned_long> _kjCondition_1;
  unsigned_long local_128;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&f,&builder.super_MessageBuilder);
  _kjCondition_1._0_8_ = f.exception;
  PointerBuilder::getStruct
            (&root._builder,(PointerBuilder *)&_kjCondition_1,(StructSize)0x2,(word *)0x0);
  *(undefined2 *)root._builder.data = 1;
  *(undefined8 *)((long)root._builder.data + 8) = 0x7b;
  MessageBuilder::getRootInternal((Builder *)&f,&builder.super_MessageBuilder);
  _kjCondition_1._0_8_ = f.exception;
  PointerBuilder::getStruct
            (&root._builder,(PointerBuilder *)&_kjCondition_1,(StructSize)0x3,(word *)0x0);
  _kjCondition.value = *root._builder.data == 1;
  if (_kjCondition.value) {
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x532,FAILED,"root.isB()","_kjCondition,",&_kjCondition);
  _kjCondition_1.right = *(unsigned_long *)((long)root._builder.data + 8);
  _kjCondition_1.left = 0x7b;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = _kjCondition_1.right == 0x7b;
  if ((!_kjCondition_1.result) && (kj::_::Debug::minSeverity < 3)) {
    local_15c = 0x7b;
    local_128 = _kjCondition_1.right;
    kj::_::Debug::
    log<char_const(&)[40],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x533,ERROR,
               "\"failed: expected \" \"(123) == (root.getB())\", _kjCondition, 123, root.getB()",
               (char (*) [40])"failed: expected (123) == (root.getB())",&_kjCondition_1,&local_15c,
               &local_128);
  }
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(Encoding, UpgradeUnion) {
  // This tests for a specific case that was broken originally.
  MallocMessageBuilder builder;

  {
    auto root = builder.getRoot<test::TestOldUnionVersion>();
    root.setB(123);
  }

  {
    auto root = builder.getRoot<test::TestNewUnionVersion>();
    ASSERT_TRUE(root.isB())
    EXPECT_EQ(123, root.getB());
  }
}